

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O0

int IsOffloadDisabled(void)

{
  if (TargetOffloadPolicy == tgt_default) {
    HandleDefaultTargetOffload();
  }
  return (int)(TargetOffloadPolicy == tgt_disabled);
}

Assistant:

static int IsOffloadDisabled() {
  if (TargetOffloadPolicy == tgt_default) HandleDefaultTargetOffload();
  return TargetOffloadPolicy == tgt_disabled;
}